

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

bool __thiscall Pathie::Path::is_symlink(Path *this)

{
  int iVar1;
  int *piVar2;
  ErrnoError *this_00;
  bool bVar3;
  string nstr;
  stat s;
  string local_c0;
  stat local_a0;
  
  utf8_to_filename(&local_c0,&this->m_path);
  iVar1 = lstat(local_c0._M_dataplus._M_p,&local_a0);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    if (iVar1 != 2) {
      this_00 = (ErrnoError *)__cxa_allocate_exception(0x30);
      ErrnoError::ErrnoError(this_00,iVar1);
      __cxa_throw(this_00,&ErrnoError::typeinfo,GlobError::~GlobError);
    }
    bVar3 = false;
  }
  else {
    bVar3 = (local_a0.st_mode & 0xf000) == 0xa000;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  return bVar3;
}

Assistant:

bool Path::is_symlink() const
{
#if defined(_PATHIE_UNIX)
  struct stat s;
  std::string nstr = native();

  if (lstat(nstr.c_str(), &s) < 0) {
    int errsav = errno;

    if (errsav == ENOENT)
      return false;
    else
      throw(Pathie::ErrnoError(errsav));
  }

  if (S_ISLNK(s.st_mode))
    return true;
  else
    return false;
#elif defined(_WIN32)
  if (!exists())
    return false;

  return false;
  // ntifs.h is currently not included in msys2
  //std::wstring path = utf8_to_utf16(m_path);
  //return is_ntfs_symlink(path.c_str());
#else
#error Unsupported system.
#endif
}